

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExtractor_impl.hpp
# Opt level: O1

void __thiscall
hiberlite::ExtractModel::
act<hiberlite::AVisitor<hiberlite::ExtractModel>,std::pair<std::__cxx11::string,std::__cxx11::string>,hiberlite::stl_map_adapter<std::__cxx11::string,std::__cxx11::string>>
          (ExtractModel *this,AVisitor<hiberlite::ExtractModel> *av,
          collection_nvp<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_hiberlite::stl_map_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *nvp)

{
  pointer pcVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *_value;
  sql_nvp<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  el;
  undefined1 local_1e0 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1c0;
  _Alloc_hider local_1b8;
  undefined1 local_1b0 [24];
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  undefined1 local_98 [40];
  _Alloc_hider local_70;
  char local_60 [16];
  string local_50;
  
  _value = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)operator_new(0x40);
  (_value->first)._M_dataplus._M_p = (pointer)&(_value->first).field_2;
  (_value->first)._M_string_length = 0;
  (_value->first).field_2._M_local_buf[0] = '\0';
  (_value->second)._M_dataplus._M_p = (pointer)&(_value->second).field_2;
  (_value->second)._M_string_length = 0;
  (_value->second).field_2._M_local_buf[0] = '\0';
  pcVar1 = (nvp->name)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (nvp->name)._M_string_length);
  AVisitor<hiberlite::ExtractModel>::diveTable(av,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_1e0._0_8_ = local_1e0 + 0x10;
  pcVar1 = (av->scope)._table._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e0,pcVar1,pcVar1 + (av->scope)._table._M_string_length);
  pcVar1 = (av->scope)._prefix._M_dataplus._M_p;
  local_1c0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_1b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,pcVar1,pcVar1 + (av->scope)._prefix._M_string_length);
  local_1b0._16_4_ = (av->scope).prefix_depth;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,local_1e0._0_8_,(pointer)(local_1e0._0_8_ + local_1e0._8_8_));
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"hiberlite_parent_id","");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"INTEGER","");
  putNamedColumn(this,&local_b8,&local_d8,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_1c0 !=
      (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)local_1b0) {
    operator_delete(local_1c0);
  }
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_);
  }
  pcVar1 = (av->scope)._table._M_dataplus._M_p;
  local_1e0._0_8_ = local_1e0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e0,pcVar1,pcVar1 + (av->scope)._table._M_string_length);
  pcVar1 = (av->scope)._prefix._M_dataplus._M_p;
  local_1c0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_1b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,pcVar1,pcVar1 + (av->scope)._prefix._M_string_length);
  local_1b0._16_4_ = (av->scope).prefix_depth;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_1e0._0_8_,(pointer)(local_1e0._0_8_ + local_1e0._8_8_));
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"hiberlite_entry_indx","");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"INTEGER","");
  putNamedColumn(this,&local_118,&local_138,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (local_1c0 !=
      (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)local_1b0) {
    operator_delete(local_1c0);
  }
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_);
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"item","");
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"");
  sql_nvp<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::sql_nvp((sql_nvp<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1e0,&local_178,_value,&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  local_98._0_8_ = local_98 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,local_1e0._0_8_,(pointer)(local_1e0._0_8_ + local_1e0._8_8_));
  local_98._32_8_ = local_1c0;
  local_70._M_p = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_1b8._M_p,local_1b8._M_p + local_1b0._0_8_);
  AVisitor<hiberlite::ExtractModel>::operator&
            (av,(sql_nvp<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_98);
  if (local_70._M_p != local_60) {
    operator_delete(local_70._M_p);
  }
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_);
  }
  AVisitor<hiberlite::ExtractModel>::popScope(av);
  access::destroy<hiberlite::ExtractModel,std::pair<std::__cxx11::string,std::__cxx11::string>>
            (this,_value);
  if (local_1b8._M_p != local_1b0 + 8) {
    operator_delete(local_1b8._M_p);
  }
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_);
  }
  return;
}

Assistant:

void ExtractModel::act(AV& av, collection_nvp<E,S> nvp )
{
	E* entry;
	construct(av, &entry, static_cast<unsigned int>(0));
		av.diveTable(nvp.name);

			putNamedColumn(av.getScope().table(), HIBERLITE_PARENTID_COLUMN, HIBERLITE_ID_STORAGE_CLASS);
			putNamedColumn(av.getScope().table(), HIBERLITE_ENTRY_INDEX_COLUMN, HIBERLITE_ID_STORAGE_CLASS);

			sql_nvp<E> el("item",*entry);
			av & el;
		av.pop();
	destroy(*this, entry, static_cast<unsigned int>(0));
}